

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_trace.c
# Opt level: O2

void trace_init_(long *n)

{
  unsigned_long uVar1;
  Boolean BVar2;
  char cVar3;
  MA_AccessIndex index;
  
  uVar1 = *n;
  if ((long)uVar1 < 1) {
    printf("trace_init>>  invalid max number of events: %ld\n");
    return;
  }
  current = 0;
  MAX_EVENTS = uVar1;
  BVar2 = MA_push_get(0x3ea,uVar1 * 2,"timeLog",&thandle,&index);
  cVar3 = BVar2 == 0;
  if ((bool)cVar3) {
    puts("trace_init>> failed to allocate memory 1");
  }
  MA_get_pointer(thandle,&tlog);
  if (tlog == (Integer *)0x0) {
    puts("trace_init>> null pointer: 1");
    cVar3 = cVar3 + '\x01';
  }
  BVar2 = MA_push_get(0x3ea,*n * 6,"indexLog",&ihandle,&index);
  if (BVar2 == 0) {
    puts("trace_init>> failed to allocate memory 2");
    cVar3 = cVar3 + '\x01';
  }
  MA_get_pointer(ihandle,&indlog);
  if (indlog == (Integer *)0x0) {
    puts("trace_init>> null pointer: 2");
    cVar3 = cVar3 + '\x01';
  }
  BVar2 = MA_push_get(0x3e9,100,"gaLog",&gahandle,&index);
  if (BVar2 == 0) {
    cVar3 = '\x01';
    puts("trace_init>> failed to allocate memory 2");
  }
  MA_get_pointer(gahandle,&galog);
  if (galog == (int *)0x0) {
    puts("trace_init>> null pointer: 2");
  }
  else if (cVar3 == '\0') {
    ganum = 0;
    return;
  }
  MAX_EVENTS = 0;
  ganum = 0;
  return;
}

Assistant:

void trace_init_(long *n)
{
    MA_AccessIndex index;
    long err;
    
    if(*n<=0){
        printf("trace_init>>  invalid max number of events: %ld\n",*n);
        return;
    }
    
    current = 0;
    err = 0;
    
    /*  MA_initialize(MT_INT,10000,10000); */ 
    
    MAX_EVENTS = *n;

    if(!MA_push_get(MT_LONGINT, *n*2, "timeLog", &thandle, &index)){
        printf("trace_init>> failed to allocate memory 1\n");
        err ++;
    }
    MA_get_pointer(thandle, &tlog);
    if(!tlog){
        printf("trace_init>> null pointer: 1\n");
        err ++;
    }

    if(!MA_push_get(MT_LONGINT, *n*6, "indexLog", &ihandle, &index)){
        printf("trace_init>> failed to allocate memory 2\n");
        err ++;
    }
    MA_get_pointer(ihandle, &indlog);
    if(!indlog) { 
        printf("trace_init>> null pointer: 2\n");
        err ++;
    }

    if(!MA_push_get(MT_INT, MAX_GAS, "gaLog", &gahandle, &index)){
        printf("trace_init>> failed to allocate memory 2\n");
        err ++;
    }
    MA_get_pointer(gahandle, &galog);
    if(!galog) { 
        printf("trace_init>> null pointer: 2\n");
        err ++;
    }
    
    ganum = 0;
    
    if(err) MAX_EVENTS = 0;
}